

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smatrix.h
# Opt level: O0

SVector<double,_3> * __thiscall
gmath::SMatrix<double,_3,_3>::operator*(SMatrix<double,_3,_3> *this,SVector<double,_3> *a)

{
  double dVar1;
  double *pdVar2;
  SVector<double,_3> *in_RDX;
  long in_RSI;
  SVector<double,_3> *in_RDI;
  double dVar3;
  int i;
  int k;
  SVector<double,_3> *ret;
  undefined4 local_20;
  undefined4 local_1c;
  
  SVector<double,_3>::SVector(in_RDI);
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      dVar1 = *(double *)(in_RSI + (long)local_1c * 0x18 + (long)local_20 * 8);
      dVar3 = SVector<double,_3>::operator[](in_RDX,local_20);
      pdVar2 = SVector<double,_3>::operator[](in_RDI,local_1c);
      *pdVar2 = dVar1 * dVar3 + *pdVar2;
    }
  }
  return in_RDI;
}

Assistant:

SVector<T, nrows> operator*(const SVector<T, ncols> &a) const
    {
      SVector<T, nrows> ret;

      for (int k=0; k<nrows; k++)
        for (int i=0; i<ncols; i++)
        {
          ret[k]+=v[k][i]*a[i];
        }

      return ret;
    }